

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::has_default_value(FieldGeneratorBase *this)

{
  Type TVar1;
  LogMessage *other;
  FieldDescriptor FVar2;
  bool bVar3;
  LogFinisher local_49;
  LogMessage local_48;
  
  TVar1 = FieldDescriptor::type(this->descriptor_);
  FVar2 = (FieldDescriptor)0x1;
  switch(TVar1) {
  case TYPE_DOUBLE:
    bVar3 = *(double *)(this->descriptor_ + 0xa0) != 0.0;
    goto LAB_00265674;
  case TYPE_FLOAT:
    bVar3 = *(float *)(this->descriptor_ + 0xa0) != 0.0;
LAB_00265674:
    FVar2 = (FieldDescriptor)(-bVar3 & 1);
    break;
  case TYPE_INT64:
  case TYPE_UINT64:
  case TYPE_FIXED64:
  case TYPE_SFIXED64:
  case MAX_TYPE:
    bVar3 = *(long *)(this->descriptor_ + 0xa0) == 0;
    goto LAB_0026563b;
  case TYPE_INT32:
  case TYPE_FIXED32:
  case TYPE_UINT32:
  case TYPE_SFIXED32:
  case TYPE_SINT32:
    bVar3 = *(int *)(this->descriptor_ + 0xa0) == 0;
LAB_0026563b:
    FVar2 = (FieldDescriptor)!bVar3;
    break;
  case TYPE_BOOL:
    FVar2 = this->descriptor_[0xa0];
    break;
  case TYPE_STRING:
  case TYPE_GROUP:
  case TYPE_MESSAGE:
  case TYPE_BYTES:
  case TYPE_ENUM:
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/csharp/csharp_field_base.cc"
               ,0xfb);
    other = internal::LogMessage::operator<<(&local_48,"Unknown field type.");
    internal::LogFinisher::operator=(&local_49,other);
    internal::LogMessage::~LogMessage(&local_48);
  }
  return (bool)FVar2;
}

Assistant:

bool FieldGeneratorBase::has_default_value() {
  switch (descriptor_->type()) {
    case FieldDescriptor::TYPE_ENUM:
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_GROUP:
      return true;
    case FieldDescriptor::TYPE_DOUBLE:
      return descriptor_->default_value_double() != 0.0;
    case FieldDescriptor::TYPE_FLOAT:
      return descriptor_->default_value_float() != 0.0;
    case FieldDescriptor::TYPE_INT64:
      return descriptor_->default_value_int64() != 0L;
    case FieldDescriptor::TYPE_UINT64:
      return descriptor_->default_value_uint64() != 0L;
    case FieldDescriptor::TYPE_INT32:
      return descriptor_->default_value_int32() != 0;
    case FieldDescriptor::TYPE_FIXED64:
      return descriptor_->default_value_uint64() != 0L;
    case FieldDescriptor::TYPE_FIXED32:
      return descriptor_->default_value_uint32() != 0;
    case FieldDescriptor::TYPE_BOOL:
      return descriptor_->default_value_bool();
    case FieldDescriptor::TYPE_STRING:
      return true;
    case FieldDescriptor::TYPE_BYTES:
      return true;
    case FieldDescriptor::TYPE_UINT32:
      return descriptor_->default_value_uint32() != 0;
    case FieldDescriptor::TYPE_SFIXED32:
      return descriptor_->default_value_int32() != 0;
    case FieldDescriptor::TYPE_SFIXED64:
      return descriptor_->default_value_int64() != 0L;
    case FieldDescriptor::TYPE_SINT32:
      return descriptor_->default_value_int32() != 0;
    case FieldDescriptor::TYPE_SINT64:
      return descriptor_->default_value_int64() != 0L;
    default:
      GOOGLE_LOG(FATAL)<< "Unknown field type.";
      return true;
  }
}